

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::error<unsigned_int_const&>
          (ValidationContext *this,IssueError *issue,uint *args)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  allocator<char> *__a;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int> *in_RDX;
  ValidationReport *extraout_RDX;
  undefined1 *in_RSI;
  long in_RDI;
  undefined1 in_stack_000000d8 [16];
  undefined1 in_stack_000000e8 [16];
  ValidationReport *in_stack_fffffffffffffe68;
  basic_string_view<char> *in_stack_fffffffffffffe70;
  ValidationReport *this_00;
  size_t in_stack_fffffffffffffe78;
  v10 *this_01;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string_view<char,_std::char_traits<char>_> local_129 [2];
  v10 avStack_100 [32];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int> *local_e0
  ;
  undefined1 *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int> *local_90
  ;
  undefined1 local_88 [16];
  v10 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_70;
  undefined8 *local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_60;
  undefined8 local_58;
  undefined8 *local_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 *local_8;
  
  *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
  local_e0 = in_RDX;
  local_d8 = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)(in_RDI + 0x2c) = uVar1;
  local_129[0]._M_len._1_1_ = *local_d8;
  local_129[0]._M_len._3_2_ = *(undefined2 *)(local_d8 + 2);
  __a = (allocator<char> *)(local_d8 + 8);
  __t = local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffeb0,__t,__a);
  this_01 = avStack_100;
  local_30 = (undefined8 *)(local_d8 + 0x18);
  local_28 = &stack0xfffffffffffffeb0;
  local_40 = *local_30;
  local_38 = *(undefined8 *)(local_d8 + 0x20);
  s._M_str = (char *)this_01;
  s._M_len = in_stack_fffffffffffffe78;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            (in_stack_fffffffffffffe70,s);
  local_8 = local_30;
  local_90 = local_e0;
  local_20 = local_88;
  local_78 = this_01;
  local_c8[0] = ::fmt::v10::
                make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int_const>
                          (local_e0,this_01,(uint *)in_stack_fffffffffffffeb0);
  local_68 = &local_b0;
  local_70 = local_c8;
  local_58 = 2;
  local_b0 = 2;
  this_00 = extraout_RDX;
  local_60 = local_70;
  local_50 = local_68;
  local_48 = local_70;
  local_a8 = local_70;
  ::fmt::v10::vformat_abi_cxx11_((string_view)in_stack_000000e8,(format_args)in_stack_000000d8);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)this_00,in_stack_fffffffffffffe68);
  ValidationReport::~ValidationReport(this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_129);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }